

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareNonCompatibleUnits_Test::~Units_compareNonCompatibleUnits_Test
          (Units_compareNonCompatibleUnits_Test *this)

{
  Units_compareNonCompatibleUnits_Test *this_local;
  
  ~Units_compareNonCompatibleUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareNonCompatibleUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::WEBER, "milli");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
}